

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

char * base64_decode(char *s,size_t len,size_t *out_len)

{
  int iVar1;
  int local_4c;
  uint local_48;
  wchar_t group_size;
  wchar_t v;
  uint i;
  uchar *src;
  char *d;
  char *out;
  size_t *out_len_local;
  size_t len_local;
  char *s_local;
  
  if (base64_decode::decode_table[0x42] != '\x01') {
    memset(base64_decode::decode_table,0xff,0x80);
    for (group_size = L'\0'; (uint)group_size < 0x40; group_size = group_size + L'\x01') {
      base64_decode::decode_table
      ["ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(uint)group_size]] =
           (uchar)group_size;
    }
  }
  s_local = (char *)malloc((len - (len >> 2)) + 1);
  _v = (byte *)s;
  src = (uchar *)s_local;
  out_len_local = (size_t *)len;
  if ((uchar *)s_local == (uchar *)0x0) {
    *out_len = 0;
    s_local = (char *)0x0;
  }
  else {
    while (out_len_local != (size_t *)0x0) {
      local_48 = 0;
      local_4c = 0;
      while (local_4c < 4 && out_len_local != (size_t *)0x0) {
        if ((*_v == 0x3d) || (*_v == 0x5f)) {
          out_len_local = (size_t *)0x0;
          break;
        }
        if (((*_v < 0x80) && (0x1f < *_v)) && (base64_decode::decode_table[*_v] != 0xff)) {
          local_48 = (uint)base64_decode::decode_table[*_v] | local_48 << 6;
          out_len_local = (size_t *)((long)out_len_local + -1);
          local_4c = local_4c + 1;
          _v = _v + 1;
        }
        else {
          out_len_local = (size_t *)((long)out_len_local + -1);
          _v = _v + 1;
        }
      }
      iVar1 = local_48 << (('\x04' - (char)local_4c) * '\x06' & 0x1fU);
      switch(local_4c) {
      case 1:
        break;
      case 4:
        src[2] = (uchar)iVar1;
      case 3:
        src[1] = (uchar)((uint)iVar1 >> 8);
      case 2:
        *src = (uchar)((uint)iVar1 >> 0x10);
      }
      src = src + (local_4c * 3) / 4;
    }
    *out_len = (long)src - (long)s_local;
  }
  return s_local;
}

Assistant:

static char *
base64_decode(const char *s, size_t len, size_t *out_len)
{
	static const unsigned char digits[64] = {
		'A','B','C','D','E','F','G','H','I','J','K','L','M','N',
		'O','P','Q','R','S','T','U','V','W','X','Y','Z','a','b',
		'c','d','e','f','g','h','i','j','k','l','m','n','o','p',
		'q','r','s','t','u','v','w','x','y','z','0','1','2','3',
		'4','5','6','7','8','9','+','/' };
	static unsigned char decode_table[128];
	char *out, *d;
	const unsigned char *src = (const unsigned char *)s;

	/* If the decode table is not yet initialized, prepare it. */
	if (decode_table[digits[1]] != 1) {
		unsigned i;
		memset(decode_table, 0xff, sizeof(decode_table));
		for (i = 0; i < sizeof(digits); i++)
			decode_table[digits[i]] = i;
	}

	/* Allocate enough space to hold the entire output. */
	/* Note that we may not use all of this... */
	out = (char *)malloc(len - len / 4 + 1);
	if (out == NULL) {
		*out_len = 0;
		return (NULL);
	}
	d = out;

	while (len > 0) {
		/* Collect the next group of (up to) four characters. */
		int v = 0;
		int group_size = 0;
		while (group_size < 4 && len > 0) {
			/* '=' or '_' padding indicates final group. */
			if (*src == '=' || *src == '_') {
				len = 0;
				break;
			}
			/* Skip illegal characters (including line breaks) */
			if (*src > 127 || *src < 32
			    || decode_table[*src] == 0xff) {
				len--;
				src++;
				continue;
			}
			v <<= 6;
			v |= decode_table[*src++];
			len --;
			group_size++;
		}
		/* Align a short group properly. */
		v <<= 6 * (4 - group_size);
		/* Unpack the group we just collected. */
		switch (group_size) {
		case 4: d[2] = v & 0xff;
			/* FALLTHROUGH */
		case 3: d[1] = (v >> 8) & 0xff;
			/* FALLTHROUGH */
		case 2: d[0] = (v >> 16) & 0xff;
			break;
		case 1: /* this is invalid! */
			break;
		}
		d += group_size * 3 / 4;
	}

	*out_len = d - out;
	return (out);
}